

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cc
# Opt level: O3

void lrit::to_json(json *j,TimeStampHeader *h)

{
  value_t t;
  json_value jVar1;
  tm *__tp;
  size_t sVar2;
  long lVar3;
  initializer_list_t init;
  initializer_list_t init_00;
  initializer_list_t init_01;
  timespec ts;
  array<char,_128UL> tsbuf;
  undefined1 *local_1b0;
  undefined8 local_1a8;
  undefined1 local_1a0;
  undefined7 uStack_19f;
  undefined8 uStack_198;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_190;
  value_t local_170 [8];
  undefined8 *local_168;
  value_t *local_160;
  undefined1 local_158;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_150;
  undefined1 local_130 [16];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *local_120;
  undefined1 local_118;
  undefined1 local_110 [8];
  json_value local_108;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_100;
  value_t local_e0 [8];
  __time_t local_d8;
  value_t *local_d0;
  undefined1 local_c8;
  timespec local_c0;
  char local_b0 [128];
  
  local_c0 = TimeStampHeader::getUnix(h);
  __tp = gmtime(&local_c0.tv_sec);
  sVar2 = strftime(local_b0,0x80,"%Y-%m-%dT%H:%M:%SZ",__tp);
  local_100.owned_value.m_type = string;
  local_100.owned_value.m_value.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::create<std::__cxx11::string,char_const(&)[5]>((char (*) [5])"Unix");
  local_100.is_rvalue = true;
  local_d0 = local_e0;
  local_e0[0] = number_integer;
  local_d8 = local_c0.tv_sec;
  local_c8 = 1;
  init._M_len = 2;
  init._M_array = &local_100;
  local_100.value_ref = &local_100.owned_value;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_150.owned_value,init,true,array);
  local_150.value_ref = &local_150.owned_value;
  local_150.is_rvalue = true;
  local_190.owned_value.m_value.object = (object_t *)0x0;
  local_190.owned_value.m_type = string;
  local_190.owned_value.m_value.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::create<std::__cxx11::string,char_const(&)[8]>((char (*) [8])"ISO8601");
  local_190.value_ref = &local_190.owned_value;
  local_190.is_rvalue = true;
  local_1b0 = &local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,local_b0,local_b0 + sVar2);
  local_168 = (undefined8 *)0x0;
  local_170[0] = string;
  local_168 = (undefined8 *)operator_new(0x20);
  local_160 = local_170;
  *local_168 = local_168 + 2;
  if (local_1b0 == &local_1a0) {
    local_168[2] = CONCAT71(uStack_19f,local_1a0);
    local_168[3] = uStack_198;
  }
  else {
    *local_168 = local_1b0;
    local_168[2] = CONCAT71(uStack_19f,local_1a0);
  }
  local_168[1] = local_1a8;
  local_1a8 = 0;
  local_1a0 = 0;
  local_158 = 1;
  init_00._M_len = 2;
  init_00._M_array = &local_190;
  local_1b0 = &local_1a0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_130,init_00,true,array);
  local_118 = 1;
  init_01._M_len = 2;
  init_01._M_array = &local_150;
  local_120 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               *)local_130;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_110,init_01,true,array);
  t = j->m_type;
  j->m_type = local_110[0];
  jVar1 = j->m_value;
  j->m_value = local_108;
  local_110[0] = t;
  local_108 = jVar1;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_110 + 8),t);
  lVar3 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_130 + lVar3 + 8),local_130[lVar3]);
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x40);
  lVar3 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)((long)&local_168 + lVar3),local_170[lVar3]);
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x40);
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,CONCAT71(uStack_19f,local_1a0) + 1);
  }
  lVar3 = 0;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)((long)&local_d8 + lVar3),local_e0[lVar3]);
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x40);
  return;
}

Assistant:

void to_json(json& j, const TimeStampHeader& h) {
  std::array<char, 128> tsbuf;
  const auto ts = h.getUnix();
  const auto len = strftime(
      tsbuf.data(), tsbuf.size(), "%Y-%m-%dT%H:%M:%SZ", gmtime(&ts.tv_sec));
  j = {
      {"Unix", ts.tv_sec},
      {"ISO8601", std::string(tsbuf.data(), len)},
  };
}